

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudioFX_volumemeter.c
# Opt level: O2

uint32_t FAudioCreateVolumeMeter(FAPO **ppApo,uint32_t Flags)

{
  FAudioCreateVolumeMeterWithCustomAllocatorEXT(ppApo,Flags,SDL_malloc,SDL_free,SDL_realloc);
  return 0;
}

Assistant:

uint32_t FAudioCreateVolumeMeter(FAPO** ppApo, uint32_t Flags)
{
	return FAudioCreateVolumeMeterWithCustomAllocatorEXT(
		ppApo,
		Flags,
		FAudio_malloc,
		FAudio_free,
		FAudio_realloc
	);
}